

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall
Fl_Text_Buffer::findchar_forward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  uint uVar1;
  int *foundPos_local;
  uint searchChar_local;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  if (startPos < this->mLength) {
    foundPos_local._4_4_ = startPos;
    if (startPos < 0) {
      foundPos_local._4_4_ = 0;
    }
    for (; foundPos_local._4_4_ < this->mLength;
        foundPos_local._4_4_ = next_char(this,foundPos_local._4_4_)) {
      uVar1 = char_at(this,foundPos_local._4_4_);
      if (searchChar == uVar1) {
        *foundPos = foundPos_local._4_4_;
        return 1;
      }
    }
    *foundPos = this->mLength;
  }
  else {
    *foundPos = this->mLength;
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::findchar_forward(int startPos, unsigned searchChar,
				     int *foundPos) const 
{
  if (startPos >= mLength) {
    *foundPos = mLength;
    return 0;
  }
  
  if (startPos<0)
    startPos = 0;
  
  for ( ; startPos<mLength; startPos = next_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = mLength;
  return 0;
}